

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::ByteMapBuilder::Build(ByteMapBuilder *this,uint8_t *bytemap,int *bytemap_range)

{
  int iVar1;
  int iVar2;
  int c;
  long lVar3;
  
  this->nextcolor_ = 0;
  lVar3 = 0;
  while (c = (int)lVar3, c < 0x100) {
    iVar1 = Bitmap256::FindNextSetBit(&this->splits_,c);
    iVar2 = Recolor(this,this->colors_[iVar1]);
    for (lVar3 = (long)c; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
      bytemap[lVar3] = (uint8_t)iVar2;
    }
  }
  *bytemap_range = this->nextcolor_;
  return;
}

Assistant:

void ByteMapBuilder::Build(uint8_t* bytemap, int* bytemap_range) {
  // Assign byte classes numbered from 0.
  nextcolor_ = 0;

  int c = 0;
  while (c < 256) {
    int next = splits_.FindNextSetBit(c);
    uint8_t b = static_cast<uint8_t>(Recolor(colors_[next]));
    while (c <= next) {
      bytemap[c] = b;
      c++;
    }
  }

  *bytemap_range = nextcolor_;
}